

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coverage.cpp
# Opt level: O0

void __thiscall
ImporterCoverage_importingComponentWithCnUnitsThatAreEmpty_Test::TestBody
          (ImporterCoverage_importingComponentWithCnUnitsThatAreEmpty_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  char *pcVar7;
  element_type *peVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3e0;
  AssertHelper local_390 [8];
  Message local_388 [8];
  shared_ptr<libcellml::Issue> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  undefined1 local_350 [8];
  AssertionResult gtest_ar_2;
  Message local_338 [8];
  unsigned_long local_330 [2];
  undefined1 local_320 [8];
  AssertionResult gtest_ar_1;
  shared_ptr<libcellml::Logger> local_300;
  AssertHelper local_2f0 [8];
  Message local_2e8 [8];
  unsigned_long local_2e0 [2];
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_2a0 [8];
  Message local_298 [15];
  bool local_289;
  undefined1 local_288 [8];
  AssertionResult gtest_ar_;
  string local_270 [39];
  allocator<char> local_249;
  string local_248 [32];
  undefined1 local_228 [8];
  ImportSourcePtr importSource;
  string local_210 [32];
  undefined1 local_1f0 [8];
  ComponentPtr c;
  string local_1d8 [39];
  allocator<char> local_1b1;
  string local_1b0 [32];
  undefined1 local_190 [8];
  UnitsPtr u;
  string local_178 [32];
  undefined1 local_158 [8];
  ModelPtr model;
  ValidatorPtr validator;
  ImporterPtr importer;
  ModelPtr importedModel;
  ParserPtr parser;
  string local_100 [8];
  string in;
  allocator<char> local_d7;
  allocator<char> local_d6;
  allocator<char> local_d5 [20];
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expectedIssues;
  ImporterCoverage_importingComponentWithCnUnitsThatAreEmpty_Test *this_local;
  
  local_c0 = &local_b8;
  expectedIssues.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,
             "Imported component \'c\' is not valid because:\n  -> Component \'c\' importing \'myComponent\' from \'not_required_resolving_import_manually\' has an error:\n   - Variable \'a\' in component \'myComponent\' does not have a valid units attribute. The attribute given is \'\'. CellML identifiers must contain one or more basic Latin alphabetic characters."
             ,&local_c1);
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_98,
             "Imported component \'c\' is not valid because:\n  -> Component \'c\' importing \'myComponent\' from \'not_required_resolving_import_manually\' has an error:\n   - Math cn element with the value \'1\' does not have a valid cellml:units attribute. CellML identifiers must contain one or more basic Latin alphabetic characters."
             ,local_d5);
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,
             "Imported component \'c\' is not valid because:\n  -> Component \'c\' importing \'myComponent\' from \'not_required_resolving_import_manually\' has an error:\n   - W3C MathML DTD error: No declaration for attribute bobs of element cn."
             ,&local_d6);
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_58,
             "Units \'\' does not have a valid name attribute. CellML identifiers must contain one or more basic Latin alphabetic characters."
             ,&local_d7);
  local_38 = &local_b8;
  local_30 = 4;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(in.field_2._M_local_buf + 0xf));
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_28,__l,
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(in.field_2._M_local_buf + 0xf));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(in.field_2._M_local_buf + 0xf));
  local_3e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38;
  do {
    local_3e0 = local_3e0 + -1;
    std::__cxx11::string::~string((string *)local_3e0);
  } while (local_3e0 != &local_b8);
  std::allocator<char>::~allocator(&local_d7);
  std::allocator<char>::~allocator(&local_d6);
  std::allocator<char>::~allocator(local_d5);
  std::allocator<char>::~allocator(&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_100,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"myModel\">\n  <units name=\"a\">\n    <unit units=\"\"/>\n  </units>\n   <component name=\"myComponent\">\n       <variable name=\"a\" units=\"\"/>\n       <math xmlns=\"http://www.w3.org/1998/Math/MathML\" xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\">\n           <apply>             <eq/>\n             <ci>a</ci>\n             <cn cellml:bobs=\"\">1</cn>\n           </apply>\n       </math>\n   </component>\n</model>"
             ,(allocator<char> *)
              ((long)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  this_00 = &importedModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  libcellml::Parser::create(SUB81(this_00,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  libcellml::Parser::parseModel
            ((string *)
             &importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  libcellml::Importer::create((bool)((char)&validator + '\b'));
  libcellml::Validator::create();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_178,"myModel",
             (allocator<char> *)
             ((long)&u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  libcellml::Model::create((string *)local_158);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b0,"",&local_1b1);
  libcellml::Units::create((string *)local_190);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1d8,"metre",
             (allocator<char> *)
             ((long)&c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Units::addUnit((string *)peVar3);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_158);
  libcellml::Model::addUnits((shared_ptr *)peVar4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_210,"c",
             (allocator<char> *)
             ((long)&importSource.
                     super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Component::create((string *)local_1f0);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&importSource.
                     super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::ImportSource::create();
  peVar5 = std::
           __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_248,"not_required_resolving_import_manually",&local_249);
  libcellml::ImportSource::setUrl((string *)peVar5);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator(&local_249);
  peVar5 = std::
           __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_228);
  libcellml::ImportSource::setModel((shared_ptr *)peVar5);
  peVar6 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_1f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_270,"myComponent",(allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  libcellml::ImportedEntity::setImportReference((string *)(peVar6 + 0x10));
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  peVar6 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_1f0);
  libcellml::ImportedEntity::setImportSource((shared_ptr *)(peVar6 + 0x10));
  peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_158);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar4);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_158);
  bVar1 = libcellml::Model::hasUnresolvedImports();
  local_289 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_288,&local_289,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar2) {
    testing::Message::Message(local_298);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar.message_,local_288,"model->hasUnresolvedImports()",
               "true");
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/coverage/coverage.cpp"
               ,0x15c,pcVar7);
    testing::internal::AssertHelper::operator=(local_2a0,local_298);
    testing::internal::AssertHelper::~AssertHelper(local_2a0);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  peVar8 = std::__shared_ptr_access<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Validator::validateModel((shared_ptr *)peVar8);
  local_2e0[1] = 4;
  std::__shared_ptr_access<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_2e0[0] = libcellml::Logger::errorCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_2d0,"size_t(4)","validator->errorCount()",local_2e0 + 1,
             local_2e0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar2) {
    testing::Message::Message(local_2e8);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
    testing::internal::AssertHelper::AssertHelper
              (local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/coverage/coverage.cpp"
               ,0x15f,pcVar7);
    testing::internal::AssertHelper::operator=(local_2f0,local_2e8);
    testing::internal::AssertHelper::~AssertHelper(local_2f0);
    testing::Message::~Message(local_2e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  std::shared_ptr<libcellml::Logger>::shared_ptr<libcellml::Validator,void>
            (&local_300,
             (shared_ptr<libcellml::Validator> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  expectEqualIssues((vector *)local_28,(shared_ptr *)&local_300);
  std::shared_ptr<libcellml::Logger>::~shared_ptr(&local_300);
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &validator.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  libcellml::Importer::flattenModel((shared_ptr *)&gtest_ar_1.message_);
  std::shared_ptr<libcellml::Model>::operator=
            ((shared_ptr<libcellml::Model> *)local_158,
             (shared_ptr<libcellml::Model> *)&gtest_ar_1.message_);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)&gtest_ar_1.message_);
  peVar8 = std::__shared_ptr_access<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Validator::validateModel((shared_ptr *)peVar8);
  local_330[1] = 1;
  std::__shared_ptr_access<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_330[0] = libcellml::Logger::errorCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_320,"size_t(1)","validator->errorCount()",local_330 + 1,
             local_330);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
  if (!bVar2) {
    testing::Message::Message(local_338);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_320);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/coverage/coverage.cpp"
               ,0x165,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_338);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
  std::__shared_ptr_access<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Logger::error((ulong)&local_380);
  std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_380);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[19],std::__cxx11::string>
            ((EqHelper<false> *)local_350,"\"The model is null.\"",
             "validator->error(0)->description()",(char (*) [19])"The model is null.",&local_370);
  std::__cxx11::string::~string((string *)&local_370);
  std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_380);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
  if (!bVar2) {
    testing::Message::Message(local_388);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_350);
    testing::internal::AssertHelper::AssertHelper
              (local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/coverage/coverage.cpp"
               ,0x166,pcVar7);
    testing::internal::AssertHelper::operator=(local_390,local_388);
    testing::internal::AssertHelper::~AssertHelper(local_390);
    testing::Message::~Message(local_388);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr
            ((shared_ptr<libcellml::ImportSource> *)local_228);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_1f0);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_190);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_158);
  std::shared_ptr<libcellml::Validator>::~shared_ptr
            ((shared_ptr<libcellml::Validator> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Importer>::~shared_ptr
            ((shared_ptr<libcellml::Importer> *)
             &validator.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &importedModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string(local_100);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_28);
  return;
}

Assistant:

TEST(ImporterCoverage, importingComponentWithCnUnitsThatAreEmpty)
{
    const std::vector<std::string> expectedIssues = {
        "Imported component 'c' is not valid because:\n"
        "  -> Component 'c' importing 'myComponent' from 'not_required_resolving_import_manually' has an error:\n"
        "   - Variable 'a' in component 'myComponent' does not have a valid units attribute. The attribute given is ''. CellML identifiers must contain one or more basic Latin alphabetic characters.",
        "Imported component 'c' is not valid because:\n"
        "  -> Component 'c' importing 'myComponent' from 'not_required_resolving_import_manually' has an error:\n"
        "   - Math cn element with the value '1' does not have a valid cellml:units attribute. CellML identifiers must contain one or more basic Latin alphabetic characters.",
        "Imported component 'c' is not valid because:\n"
        "  -> Component 'c' importing 'myComponent' from 'not_required_resolving_import_manually' has an error:\n"
        "   - W3C MathML DTD error: No declaration for attribute bobs of element cn.",
        "Units '' does not have a valid name attribute. CellML identifiers must contain one or more basic Latin alphabetic characters.",
    };

    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"myModel\">\n"
        "  <units name=\"a\">\n"
        "    <unit units=\"\"/>\n"
        "  </units>\n"
        "   <component name=\"myComponent\">\n"
        "       <variable name=\"a\" units=\"\"/>\n"
        "       <math xmlns=\"http://www.w3.org/1998/Math/MathML\" xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\">\n"
        "           <apply>"
        "             <eq/>\n"
        "             <ci>a</ci>\n"
        "             <cn cellml:bobs=\"\">1</cn>\n"
        "           </apply>\n"
        "       </math>\n"
        "   </component>\n"
        "</model>";

    // Create the model by parsing the string above.
    auto parser = libcellml::Parser::create();
    auto importedModel = parser->parseModel(in);
    auto importer = libcellml::Importer::create();
    auto validator = libcellml::Validator::create();

    auto model = libcellml::Model::create("myModel");
    auto u = libcellml::Units::create("");
    u->addUnit("metre");
    model->addUnits(u);

    auto c = libcellml::Component::create("c");

    auto importSource = libcellml::ImportSource::create();
    importSource->setUrl("not_required_resolving_import_manually");
    importSource->setModel(importedModel);

    c->setImportReference("myComponent");
    c->setImportSource(importSource);
    model->addComponent(c);

    EXPECT_FALSE(model->hasUnresolvedImports());

    validator->validateModel(model);
    EXPECT_EQ(size_t(4), validator->errorCount());
    expectEqualIssues(expectedIssues, validator);

    model = importer->flattenModel(model);

    validator->validateModel(model);
    EXPECT_EQ(size_t(1), validator->errorCount());
    EXPECT_EQ("The model is null.", validator->error(0)->description());
}